

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_relay.cpp
# Opt level: O0

bool __thiscall UDPRelay::AddToLoop(UDPRelay *this,EventLoop *event_loop)

{
  Log *pLVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  EventLoop *local_20;
  EventLoop *event_loop_local;
  UDPRelay *this_local;
  
  local_20 = event_loop;
  event_loop_local = (EventLoop *)this;
  if (this->event_loop_ == (EventLoop *)0x0) {
    if ((this->is_closed_ & 1U) == 0) {
      this->event_loop_ = event_loop;
      EventLoop::Add(this->event_loop_,this->server_socket_,9,&this->super_ISockNotify);
      this_local._7_1_ = true;
    }
    else {
      pLVar1 = Log::GetInstance();
      pLVar1 = Log::operator<<(pLVar1,yellow);
      Log::FormatTime_abi_cxx11_();
      pLVar1 = Log::operator<<(pLVar1,&local_70);
      pLVar1 = Log::operator<<(pLVar1,(char (*) [12])" [warning] ");
      Log::operator<<(pLVar1,(char (*) [15])"already closed");
      std::__cxx11::string::~string((string *)&local_70);
      this_local._7_1_ = false;
    }
  }
  else {
    pLVar1 = Log::GetInstance();
    pLVar1 = Log::operator<<(pLVar1,yellow);
    Log::FormatTime_abi_cxx11_();
    pLVar1 = Log::operator<<(pLVar1,&local_40);
    pLVar1 = Log::operator<<(pLVar1,(char (*) [12])" [warning] ");
    Log::operator<<(pLVar1,(char (*) [20])"already add to loop");
    std::__cxx11::string::~string((string *)&local_40);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool UDPRelay::AddToLoop(EventLoop * event_loop)
{
    if (event_loop_)
    {
        LOGW << "already add to loop";
        return false;
    }
    if (is_closed_)
    {
        LOGW << "already closed";
        return false;
    }
    event_loop_ = event_loop;
    event_loop_->Add(server_socket_, kPollIn | kPollErr, this);
    return true;
}